

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParseException.cpp
# Opt level: O2

void __thiscall
rc::detail::ParseException::ParseException(ParseException *this,size_type pos,string *msg)

{
  string sStack_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  *(undefined ***)this = &PTR__ParseException_001a8288;
  this->m_pos = pos;
  std::__cxx11::string::string((string *)&this->m_msg,(string *)msg);
  std::__cxx11::to_string(&sStack_78,this->m_pos);
  std::operator+(&local_58,"@",&sStack_78);
  std::operator+(&local_38,&local_58,": ");
  std::operator+(&this->m_what,&local_38,msg);
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&sStack_78);
  return;
}

Assistant:

ParseException::ParseException(std::string::size_type pos,
                               const std::string &msg)
    : m_pos(pos)
    , m_msg(msg)
    , m_what("@" + std::to_string(m_pos) + ": " + msg) {}